

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O1

EvalResult
EvalModel(IDenseNetwork *network,
         vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
         *data,vector<float,_std::allocator<float>_> *target,float simulationTime,float eps,
         string *logsPath)

{
  ulong uVar1;
  undefined4 uVar2;
  ulong uVar3;
  pointer pvVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  EvalResult EVar13;
  float S;
  vector<float,_std::allocator<float>_> output;
  vector<float,_std::allocator<float>_> softMax;
  vector<float,_std::allocator<float>_> deltas;
  ofstream out;
  float local_2e4;
  float local_2e0;
  float local_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  vector<float,_std::allocator<float>_> local_2b0;
  float local_298;
  undefined4 uStack_294;
  undefined8 uStack_290;
  vector<float,_std::allocator<float>_> local_288;
  vector<float,_std::allocator<float>_> local_268;
  undefined1 local_248 [16];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)logsPath);
  pvVar4 = (data->
           super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((data->
      super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pvVar4) {
    local_2e4 = 0.0;
    local_2c8._0_4_ = 0.0;
    local_2c8._4_4_ = 0;
    uStack_2c0 = 0;
    local_298 = 0.0;
    uStack_294 = 0;
    uStack_290 = 0;
  }
  else {
    local_298 = 0.0;
    uStack_294 = 0;
    uStack_290 = 0;
    local_2c8._0_4_ = 0.0;
    local_2c8._4_4_ = 0;
    uStack_2c0 = 0;
    local_2e4 = 0.0;
    uVar10 = 0;
    do {
      IDenseNetwork::Forward(&local_2b0,network,pvVar4 + uVar10,simulationTime,false);
      uVar1 = uVar10 + 1;
      iVar9 = (int)uVar1;
      if (((uint)(iVar9 * 0x26e978d5) >> 3 | iVar9 * -0x60000000) < 0x418938) {
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5," samples has been forwarded",0x1b);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_2cc = 0.0;
      fVar11 = SoftMaxLoss(&local_2b0,
                           (target->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar10],&local_288,&local_268,&local_2cc
                          );
      poVar5 = std::ostream::_M_insert<double>((double)fVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
      local_2e0 = *local_2b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
      uVar6 = (long)local_2b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_2b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      if (uVar6 < 2) {
        local_248 = ZEXT816(0);
      }
      else {
        uVar7 = 1;
        uVar8 = 0;
        fVar12 = local_2e0;
        do {
          local_2e0 = local_2b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7];
          uVar3 = uVar7;
          if (local_2e0 <= fVar12) {
            local_2e0 = fVar12;
            uVar3 = uVar8;
          }
          uVar8 = uVar3;
          uVar7 = uVar7 + 1;
          fVar12 = local_2e0;
        } while (uVar6 != uVar7);
        local_248 = ZEXT416((uint)(float)(int)uVar8);
      }
      fVar12 = (target->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar10];
      IDenseNetwork::Reset(network);
      if (local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_288.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_2b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (float *)0x0) {
        operator_delete(local_2b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_2c8._0_4_ =
           (float)local_2c8 +
           (float)(-(uint)(ABS((float)(~-(uint)(0.0 < local_2e0) & 0xbf800000 |
                                      local_248._0_4_ & -(uint)(0.0 < local_2e0)) - fVar12) < eps) &
                  0x3f800000);
      local_298 = local_298 + fVar11;
      local_2e4 = local_2e4 + fVar11 * fVar11;
      pvVar4 = (data->
               super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar6 = ((long)(data->
                     super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
              -0x5555555555555555;
      uVar10 = uVar1;
    } while (uVar1 <= uVar6 && uVar6 - uVar1 != 0);
  }
  std::ofstream::close();
  uVar2 = local_2c8._4_4_;
  fVar11 = (float)(ulong)(((long)(data->
                                 super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(data->
                                 super__Vector_base<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x5555555555555555);
  local_2c8 = CONCAT44(local_298 / fVar11,(float)local_2c8 / fVar11);
  uStack_2c0 = CONCAT44(uStack_294,uVar2);
  EVar13.meanSquaredLoss = local_2e4 / fVar11;
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  EVar13.accuracy = (float)local_2c8;
  EVar13.meanLoss = (float)local_2c8._4_4_;
  return EVar13;
}

Assistant:

EvalResult EvalModel( IDenseNetwork *network, std::vector<SPIKING_NN::SpikeTrain> &data,
                      std::vector<SPIKING_NN::Target> &target, float
                      simulationTime, float
                      eps,
                      std::string &logsPath )
{
    float totalLoss = 0;
    float guesses = 0;
    float squaredLossSum = 0;
    std::ofstream out;
    out.open( logsPath );

    for ( int sampleId = 0; sampleId < data.size(); sampleId++ ) {
        std::vector<float> output = network->Forward( data[sampleId], simulationTime, false );
        if (( sampleId + 1 ) % 1000 == 0 ) {
            std::cout << sampleId + 1 << " / " << data.size() << " samples has been forwarded" << std::endl;
        }

        std::vector<float> deltas;
        std::vector<float> softMax;
        float S = 0;
        float loss = SoftMaxLoss( output, target[sampleId], softMax, deltas, &S );
        out << loss << ",";
        totalLoss += loss;
        squaredLossSum += loss * loss;
        int predictedClassId = GetClassPrediction( output );
        int guess = abs((float) predictedClassId - target[sampleId] ) < eps;
        guesses += guess;
        network->Reset();
    }
    out.close();
    return {guesses / data.size(), totalLoss / data.size(), squaredLossSum / data.size()};
}